

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

bool __thiscall
poplar::
compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::add_child(compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            *this,uint64_t *node_id,uint64_t symb)

{
  bool bVar1;
  type_conflict *ptVar2;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_00;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *pcVar3;
  uint64_t uVar4;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_01;
  undefined8 *in_RSI;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RDI;
  uint64_t cnt;
  uint64_t i;
  type_conflict *mod;
  type_conflict *quo;
  uint64_t in_stack_ffffffffffffff98;
  split_mix_hasher *in_stack_ffffffffffffffa0;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffffb0;
  uint64_t slot_id;
  uint64_t in_stack_ffffffffffffffb8;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_02;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffffc0;
  
  make_key_(in_stack_ffffffffffffffb0,(uint64_t)in_RDI,(uint64_t)in_stack_ffffffffffffffa0);
  bijective_hash::split_mix_hasher::hash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  decompose_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ptVar2 = std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x1cd2dd)
  ;
  this_00 = (compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)std::get<1ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)0x1cd2ec);
  this_01 = *(compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              **)&this_00->hasher_;
  slot_id = 1;
  do {
    this_02 = this_01;
    pcVar3 = (compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              *)get_root(in_RDI);
    if (this_01 != pcVar3) {
      bVar1 = compare_dsp_(this_02,slot_id,(uint64_t)in_RDI);
      if (bVar1) {
        if (in_RDI->size_ == in_RDI->max_size_) {
          return false;
        }
        update_slot_(this_00,(uint64_t)this_02,slot_id,(uint64_t)in_RDI);
        in_RDI->size_ = in_RDI->size_ + 1;
        *in_RSI = this_02;
        return true;
      }
      bVar1 = compare_dsp_(this_02,slot_id,(uint64_t)in_RDI);
      if (bVar1) {
        in_stack_ffffffffffffff98 = *ptVar2;
        uVar4 = get_quo_(this_01,in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffff98 == uVar4) {
          *in_RSI = this_02;
          return false;
        }
      }
    }
    this_01 = (compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)right_(this_01,in_stack_ffffffffffffff98);
    slot_id = slot_id + 1;
  } while( true );
}

Assistant:

bool add_child(uint64_t& node_id, uint64_t symb) {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        auto [quo, mod] = decompose_(hasher_.hash(make_key_(node_id, symb)));

        for (uint64_t i = mod, cnt = 1;; i = right_(i), ++cnt) {
            // because the root's dsp value is zero though it is defined
            if (i == get_root()) {
                continue;
            }

            if (compare_dsp_(i, 0)) {
                // this slot is empty
                if (size_ == max_size_) {
                    return false;  // needs to expand
                }

                update_slot_(i, quo, cnt);

                ++size_;
                node_id = i;

                return true;
            }

            if (compare_dsp_(i, cnt) and quo == get_quo_(i)) {
                node_id = i;
                return false;  // already stored
            }
        }
    }